

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O2

void ppMulEq(word *c,word *a,word *b,size_t n,void *stack)

{
  word *pwVar1;
  word *a_00;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (n < 10) {
    (*_mul_procs[n])(c,a,b,stack);
    return;
  }
  if ((n & 1) == 0) {
    uVar3 = n >> 1;
    ppMulEq(c,a,b,uVar3,stack);
    pwVar1 = (word *)((long)b + n * 4);
    a_00 = (word *)((long)a + n * 4);
    ppMulEq(c + n,a_00,pwVar1,uVar3,stack);
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      *(word *)((long)stack + uVar2 * 8) = a_00[uVar2] ^ a[uVar2];
      *(word *)((long)stack + uVar2 * 8 + n * 4) = pwVar1[uVar2] ^ b[uVar2];
      *(word *)((long)stack + uVar2 * 8 + n * 8) =
           (c + n)[uVar2] ^ *(ulong *)((long)c + uVar2 * 8 + n * 4);
    }
    ppMulEq(c + uVar3,(word *)stack,(word *)((long)stack + uVar3 * 8),uVar3,
            (void *)((long)stack + uVar3 * 0x18));
    uVar2 = uVar3;
    while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
      c[uVar3] = c[uVar3] ^ *(ulong *)((long)stack + n * 8) ^ *c;
      c[n] = c[n] ^ *(ulong *)((long)stack + n * 8) ^ c[uVar3 * 3];
      c = c + 1;
      stack = (void *)((long)stack + 8);
    }
  }
  else {
    uVar3 = n + 1 >> 1;
    ppMulEq(c,a,b,uVar3,stack);
    pwVar1 = (word *)((long)a + n * 4 + 4);
    ppMulEq(c + n + 1,pwVar1,(word *)((long)b + n * 4 + 4),n - uVar3,stack);
    for (uVar2 = 1; uVar2 < uVar3; uVar2 = uVar2 + 1) {
      *(word *)((long)stack + uVar2 * 8 + -8) = a[uVar2 - 1] ^ pwVar1[uVar2 - 1];
      *(ulong *)((long)stack + uVar2 * 8 + n * 4 + -4) =
           *(ulong *)((long)b + uVar2 * 8 + n * 4 + -4) ^ b[uVar2 - 1];
      *(word *)((long)stack + uVar2 * 8 + n * 8) =
           c[n + uVar2] ^ *(ulong *)((long)c + uVar2 * 8 + n * 4 + -4);
    }
    *(word *)((long)stack + uVar2 * 8 + -8) = a[uVar2 - 1];
    *(word *)((long)stack + uVar3 * 8 + uVar2 * 8 + -8) = b[uVar2 - 1];
    pwVar1 = c + uVar3;
    *(word *)((long)stack + uVar2 * 8 + n * 8) = c[n + uVar2] ^ pwVar1[uVar2 - 1];
    ppMulEq(pwVar1,(word *)stack,(word *)((long)stack + uVar3 * 8),uVar3,
            (void *)((long)stack + uVar3 * 0x18));
    for (uVar2 = 2;
        pwVar1[uVar2 - 2] =
             pwVar1[uVar2 - 2] ^ *(ulong *)((long)stack + uVar2 * 8 + n * 8 + -8) ^ c[uVar2 - 2],
        uVar2 < uVar3; uVar2 = uVar2 + 1) {
      c[n + (uVar2 - 1)] =
           c[n + (uVar2 - 1)] ^
           *(ulong *)((long)stack + uVar2 * 8 + n * 8 + -8) ^ c[uVar3 * 3 + (uVar2 - 2)];
    }
    c[uVar2 + (n - 1)] = c[uVar2 + (n - 1)] ^ *(ulong *)((long)stack + uVar2 * 8 + n * 8 + -8);
    pwVar1[uVar2 - 1] =
         pwVar1[uVar2 - 1] ^ *(ulong *)((long)stack + uVar2 * 8 + n * 8) ^ c[uVar2 - 1];
    c[uVar2 + n] = c[uVar2 + n] ^ *(ulong *)((long)stack + uVar2 * 8 + n * 8);
  }
  return;
}

Assistant:

static void ppMulEq(word c[], const word a[], const word b[], size_t n,
	void* stack)
{
	ASSERT(wwIsDisjoint2(a, n, c, 2 * n));
	ASSERT(wwIsDisjoint2(b, n, c, 2 * n));
	// умножение многочленов малой длины
	if (n < COUNT_OF(_mul_procs))
		_mul_procs[n](c, a, b, stack);
	// усеченный алгоритм Карацубы, n --- четное
	else if ((n & 1) == 0)
	{
		word* t = (word*)stack;
		size_t m = n / 2, i;
		// c1 || c0 <- a0 b0
		ppMulEq(c, a, b, m, t);
		// c3 || c2 <- a1 b1
		ppMulEq(c + 2 * m, a + m, b + m, m, t);
		// t0 <- a0 + a1, t1 <- b0 + b1, t2 <- c1 + c2
		for (i = 0; i < m; ++i)
			t[i] = a[i] ^ a[m + i],
			t[m + i] = b[i] ^ b[m + i],
			t[2 * m + i] = c[m + i] ^ c[2 * m + i];
		// c2 || c1 <- t0 t1
		ppMulEq(c + m, t, t + m, m, t + 3 * m);
		// c1 <- c1 + c0 + t2, c2 <- c2 + c3 + t2
		for (i = 0; i < m; ++i)
			c[m + i] ^= c[i] ^ t[2 * m + i],
			c[2 * m + i] ^= c[3 * m + i] ^ t[2 * m + i];
	}
	// усеченный алгоритм Карацубы, n --- нечетное
	else
	{
		word* t = (word*)stack;
		size_t m = (n + 1) / 2, i;
		// c1 || c0 <- a0 b0
		ppMulEq(c, a, b, m, t);
		// c3 || c2 <- a1 b1
		ppMulEq(c + 2 * m, a + m, b + m, n - m, t);
		// t0 <- a0 + a1, t1 <- b0 + b1, t2 <- c1 + c2
		for (i = 0; i + 1 < m; ++i)
			t[i] = a[i] ^ a[m + i],
			t[m + i] = b[i] ^ b[m + i],
			t[2 * m + i] = c[m + i] ^ c[2 * m + i];
		t[i] = a[i];
		t[m + i] = b[i];
		t[2 * m + i] = c[m + i] ^ c[2 * m + i];
		// c2 || c1 <- t0 t1
		ppMulEq(c + m, t, t + m, m, t + 3 * m);
		// c1 <- c1 + c0 + t2, c2 <- c2 + c3 + t2
		for (i = 0; i + 2 < m; ++i)
			c[m + i] ^= c[i] ^ t[2 * m + i],
			c[2 * m + i] ^= c[3 * m + i] ^ t[2 * m + i];
		c[m + i] ^= c[i] ^ t[2 * m + i];
		c[2 * m + i] ^= t[2 * m + i];
		++i;
		c[m + i] ^= c[i] ^ t[2 * m + i];
		c[2 * m + i] ^= t[2 * m + i];
	}
}